

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O1

int to_speex_quality(cubeb_resampler_quality q)

{
  int iVar1;
  
  iVar1 = -1;
  if (q < (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT)) {
    iVar1 = q + (CUBEB_RESAMPLER_QUALITY_DESKTOP|CUBEB_RESAMPLER_QUALITY_DEFAULT);
  }
  return iVar1;
}

Assistant:

int
to_speex_quality(cubeb_resampler_quality q)
{
  switch (q) {
  case CUBEB_RESAMPLER_QUALITY_VOIP:
    return SPEEX_RESAMPLER_QUALITY_VOIP;
  case CUBEB_RESAMPLER_QUALITY_DEFAULT:
    return SPEEX_RESAMPLER_QUALITY_DEFAULT;
  case CUBEB_RESAMPLER_QUALITY_DESKTOP:
    return SPEEX_RESAMPLER_QUALITY_DESKTOP;
  default:
    assert(false);
    return 0XFFFFFFFF;
  }
}